

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::~olc_db(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *this)

{
  bool bVar1;
  qsbr *this_00;
  type word;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  this_00 = qsbr::instance();
  word = qsbr::get_state(this_00);
  bVar1 = qsbr_state::single_thread_mode(word);
  if (!bVar1) {
    __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x65a,
                  "unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::~olc_db() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  delete_root_subtree(this);
  return;
}

Assistant:

olc_db<Key, Value>::~olc_db() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  delete_root_subtree();
}